

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintsGroup.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::ConstraintsGroup::constraintJacobianWRTControl
          (ConstraintsGroup *this,double time,VectorDynSize *state,VectorDynSize *control,
          MatrixDynSize *jacobian)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar4;
  long *plVar5;
  bool bVar6;
  char cVar7;
  ulong uVar8;
  undefined8 uVar9;
  void *__s;
  long lVar10;
  size_t sVar11;
  size_t sVar12;
  long lVar13;
  long lVar14;
  string *psVar15;
  ostream *poVar16;
  ulong uVar17;
  reverse_iterator constraintIterator;
  ostringstream errorMsg;
  pointer local_1f8;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_1f0;
  double local_1d0;
  element_type **local_1c8;
  ulong local_1c0;
  undefined8 local_1b8;
  pointer local_1b0;
  long lStack_1a8;
  long local_1a0;
  long local_190;
  undefined8 uStack_188;
  long local_180;
  ios_base local_158 [264];
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  local_1d0 = time;
  bVar6 = isAnyTimeGroup(this);
  if (bVar6) {
    p_Var2 = (this->m_pimpl->group)._M_h._M_before_begin._M_nxt;
    p_Var3 = p_Var2[5]._M_nxt;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2[6]._M_nxt;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    cVar7 = (*(code *)p_Var3->_M_nxt->_M_nxt[5]._M_nxt)
                      (SUB84(local_1d0,0),p_Var3->_M_nxt,state,control,jacobian);
    if (cVar7 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8,"Failed to evaluate ",0x13);
      psVar15 = Constraint::name_abi_cxx11_((Constraint *)p_Var3->_M_nxt);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1c8,(psVar15->_M_dataplus)._M_p,
                           psVar15->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      std::ostream::put((char)poVar16);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("ConstraintsGroup","constraintJacobianWRTControl",
                 (char *)local_1f0.
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                         .
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
    }
    else {
      sVar11 = iDynTree::MatrixDynSize::rows();
      sVar12 = Constraint::constraintSize((Constraint *)p_Var3->_M_nxt);
      if (sVar11 == sVar12) {
        lVar13 = iDynTree::MatrixDynSize::cols();
        lVar14 = iDynTree::VectorDynSize::size();
        bVar6 = true;
        if (lVar13 == lVar14) goto LAB_00178002;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1c8,"The control jacobian of constraint ",0x23);
        psVar15 = Constraint::name_abi_cxx11_((Constraint *)p_Var3->_M_nxt);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1c8,(psVar15->_M_dataplus)._M_p,
                             psVar15->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16," has a number of columns different from the control size.",0x39);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
        std::ostream::put((char)poVar16);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("ConstraintsGroup","constraintJacobianWRTControl",
                   (char *)local_1f0.
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           .
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_data);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1c8,"The control jacobian of constraint ",0x23);
        psVar15 = Constraint::name_abi_cxx11_((Constraint *)p_Var3->_M_nxt);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1c8,(psVar15->_M_dataplus)._M_p,
                             psVar15->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16," has a number of rows different from the size of the constraint.",0x40);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
        std::ostream::put((char)poVar16);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("ConstraintsGroup","constraintJacobianWRTControl",
                   (char *)local_1f0.
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           .
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_data);
      }
    }
    if ((variable_if_dynamic<long,__1> *)
        local_1f0.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data !=
        &local_1f0.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols) {
      operator_delete(local_1f0.
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data,local_1f0.
                              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                              .
                              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                              .m_cols.m_value + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c8);
    std::ios_base::~ios_base(local_158);
    bVar6 = false;
LAB_00178002:
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    return bVar6;
  }
  uVar8 = iDynTree::MatrixDynSize::rows();
  if (uVar8 == this->m_pimpl->maxConstraintSize) {
    lVar13 = iDynTree::MatrixDynSize::cols();
    lVar14 = iDynTree::VectorDynSize::size();
    if (lVar13 == lVar14) goto LAB_00177a36;
  }
  uVar1 = this->m_pimpl->maxConstraintSize;
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize((ulong)jacobian,(ulong)uVar1);
LAB_00177a36:
  local_1f0.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           (this->m_pimpl->orderedIntervals).
           super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1c8 = (element_type **)
              (this->m_pimpl->orderedIntervals).
              super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>>,__gnu_cxx::__ops::_Iter_pred<iDynTree::optimalcontrol::ConstraintsGroup::ConstraintsGroupPimpl::findActiveConstraint(double)::_lambda(std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>const&)_1_>>
            (SUB84(local_1d0,0),&local_1f8);
  if (local_1f8 !=
      (this->m_pimpl->orderedIntervals).
      super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    peVar4 = local_1f8[-1].
             super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    plVar5 = *(long **)&peVar4->constraint;
    cVar7 = (**(code **)(*plVar5 + 0x28))
                      (SUB84(local_1d0,0),plVar5,state,control,&peVar4->controlJacobianBuffer);
    if (cVar7 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8,"Failed to evaluate ",0x13);
      psVar15 = Constraint::name_abi_cxx11_
                          (*(Constraint **)
                            &(local_1f8[-1].
                              super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->constraint);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1c8,(psVar15->_M_dataplus)._M_p,
                           psVar15->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      std::ostream::put((char)poVar16);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("ConstraintsGroup","constraintJacobianWRTControl",
                 (char *)local_1f0.
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                         .
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
    }
    else {
      sVar11 = iDynTree::MatrixDynSize::rows();
      sVar12 = Constraint::constraintSize
                         (*(Constraint **)
                           &(local_1f8[-1].
                             super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->constraint);
      if (sVar11 == sVar12) {
        lVar13 = iDynTree::MatrixDynSize::cols();
        lVar14 = iDynTree::VectorDynSize::size();
        if (lVar13 == lVar14) {
          sVar11 = Constraint::constraintSize
                             (*(Constraint **)
                               &(local_1f8[-1].
                                 super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->constraint);
          if (sVar11 < this->m_pimpl->maxConstraintSize) {
            toEigen(&local_1f0,
                    &(local_1f8[-1].
                      super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->controlJacobianBuffer);
            toEigen(&local_50,jacobian);
            uVar9 = iDynTree::MatrixDynSize::rows();
            local_1b8 = iDynTree::VectorDynSize::size();
            local_1c8 = (element_type **)
                        local_50.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_data;
            local_1b0 = (pointer)local_50.
                                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                 .
                                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                 .m_data;
            lStack_1a8 = local_50.
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                         .
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_rows.m_value;
            local_1a0 = local_50.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_cols.m_value;
            local_190 = 0;
            uStack_188 = 0;
            local_180 = local_50.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_cols.m_value;
            local_1c0 = uVar9;
            Eigen::
            Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>
            ::operator=((Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>
                         *)&local_1c8,
                        (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                         *)&local_1f0);
            uVar1 = this->m_pimpl->maxConstraintSize;
            sVar11 = Constraint::constraintSize
                               (*(Constraint **)
                                 &(local_1f8[-1].
                                   super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->constraint);
            toEigen(&local_1f0,jacobian);
            lVar13 = iDynTree::MatrixDynSize::rows();
            local_1b8 = iDynTree::VectorDynSize::size();
            local_1c8 = &((__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                           *)local_1f0.
                             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                             .
                             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                             .m_data)->_M_ptr +
                        local_1f0.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_cols.m_value * lVar13;
            local_1b0 = (pointer)local_1f0.
                                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                 .
                                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                 .m_data;
            lStack_1a8 = local_1f0.
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                         .
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_rows.m_value;
            local_1a0 = local_1f0.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_cols.m_value;
            uStack_188 = 0;
            local_180 = local_1f0.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_cols.m_value;
            local_1c0 = (ulong)(uVar1 - (int)sVar11);
            local_190 = lVar13;
            Eigen::
            DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>_>
            ::setZero((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
                       *)&local_1c8);
          }
          else {
            iDynTree::MatrixDynSize::operator=
                      (jacobian,&(local_1f8[-1].
                                  super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->controlJacobianBuffer);
          }
          return true;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1c8,"The control jacobian of constraint ",0x23);
        psVar15 = Constraint::name_abi_cxx11_
                            (*(Constraint **)
                              &(local_1f8[-1].
                                super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->constraint);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1c8,(psVar15->_M_dataplus)._M_p,
                             psVar15->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16," has a number of columns different from the control size.",0x39);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
        std::ostream::put((char)poVar16);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("ConstraintsGroup","constraintJacobianWRTControl",
                   (char *)local_1f0.
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           .
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_data);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1c8,"The control jacobian of constraint ",0x23);
        psVar15 = Constraint::name_abi_cxx11_
                            (*(Constraint **)
                              &(local_1f8[-1].
                                super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->constraint);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1c8,(psVar15->_M_dataplus)._M_p,
                             psVar15->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16," has a number of rows different from the size of the constraint.",0x40);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
        std::ostream::put((char)poVar16);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("ConstraintsGroup","constraintJacobianWRTControl",
                   (char *)local_1f0.
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           .
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_data);
      }
    }
    if ((variable_if_dynamic<long,__1> *)
        local_1f0.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data !=
        &local_1f0.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols) {
      operator_delete(local_1f0.
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data,local_1f0.
                              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                              .
                              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                              .m_cols.m_value + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c8);
    std::ios_base::~ios_base(local_158);
    return false;
  }
  __s = (void *)iDynTree::MatrixDynSize::data();
  lVar13 = iDynTree::MatrixDynSize::rows();
  lVar14 = iDynTree::MatrixDynSize::cols();
  uVar17 = lVar14 * lVar13;
  uVar8 = uVar17;
  if ((((ulong)__s & 7) == 0) &&
     (uVar8 = (ulong)((uint)((ulong)__s >> 3) & 1), (long)uVar17 <= (long)uVar8)) {
    uVar8 = uVar17;
  }
  lVar13 = uVar17 - uVar8;
  if (0 < (long)uVar8) {
    memset(__s,0,uVar8 * 8);
  }
  lVar14 = (lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffeU) + uVar8;
  if (1 < lVar13) {
    lVar10 = uVar8 + 2;
    if ((long)(uVar8 + 2) < lVar14) {
      lVar10 = lVar14;
    }
    memset((void *)((long)__s + uVar8 * 8),0,(~uVar8 + lVar10 & 0xfffffffffffffffe) * 8 + 0x10);
  }
  if (uVar17 - lVar14 == 0 || (long)uVar17 < lVar14) {
    return true;
  }
  memset((void *)((long)__s + uVar8 * 8 + (lVar13 / 2) * 0x10),0,(uVar17 - lVar14) * 8);
  return true;
}

Assistant:

bool ConstraintsGroup::constraintJacobianWRTControl(double time,
                                                            const VectorDynSize &state,
                                                            const VectorDynSize &control,
                                                            MatrixDynSize &jacobian)
        {
            if (isAnyTimeGroup()){
                TimedConstraint_ptr loneConstraint = m_pimpl->group.begin()->second;
                if (!(loneConstraint->constraint->constraintJacobianWRTControl(time, state, control, jacobian))) {
                    std::ostringstream errorMsg;
                    errorMsg << "Failed to evaluate "<< loneConstraint->constraint->name() << std::endl;
                    reportError("ConstraintsGroup", "constraintJacobianWRTControl", errorMsg.str().c_str());
                    return false;
                }

                if (jacobian.rows() != loneConstraint->constraint->constraintSize()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The control jacobian of constraint "<< loneConstraint->constraint->name() << " has a number of rows different from the size of the constraint." << std::endl;
                    reportError("ConstraintsGroup", "constraintJacobianWRTControl", errorMsg.str().c_str());
                    return false;
                }

                if (jacobian.cols() != control.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The control jacobian of constraint "<< loneConstraint->constraint->name() << " has a number of columns different from the control size." << std::endl;
                    reportError("ConstraintsGroup", "constraintJacobianWRTControl", errorMsg.str().c_str());
                    return false;
                }

                return true;
            }

            if ((jacobian.rows() != m_pimpl->maxConstraintSize)||(jacobian.cols() != control.size())) {
                jacobian.resize(m_pimpl->maxConstraintSize, control.size());
            }

            std::vector< TimedConstraint_ptr >::reverse_iterator constraintIterator = m_pimpl->findActiveConstraint(time);
            if (constraintIterator == m_pimpl->orderedIntervals.rend()){ //no active constraint
                toEigen(jacobian).setZero();
                return true;
            }

            if (!(constraintIterator->get()->constraint->constraintJacobianWRTControl(time, state, control,
                                                                                     constraintIterator->get()->controlJacobianBuffer))) {
                std::ostringstream errorMsg;
                errorMsg << "Failed to evaluate "<< constraintIterator->get()->constraint->name() << std::endl;
                reportError("ConstraintsGroup", "constraintJacobianWRTControl", errorMsg.str().c_str());
                return false;
            }

            if (constraintIterator->get()->controlJacobianBuffer.rows() != constraintIterator->get()->constraint->constraintSize()) {
                std::ostringstream errorMsg;
                errorMsg << "The control jacobian of constraint "<< constraintIterator->get()->constraint->name() << " has a number of rows different from the size of the constraint." << std::endl;
                reportError("ConstraintsGroup", "constraintJacobianWRTControl", errorMsg.str().c_str());
                return false;
            }

            if (constraintIterator->get()->controlJacobianBuffer.cols() != control.size()) {
                std::ostringstream errorMsg;
                errorMsg << "The control jacobian of constraint "<< constraintIterator->get()->constraint->name() << " has a number of columns different from the control size." << std::endl;
                reportError("ConstraintsGroup", "constraintJacobianWRTControl", errorMsg.str().c_str());
                return false;
            }

            if (constraintIterator->get()->constraint->constraintSize() < m_pimpl->maxConstraintSize) {
                toEigen(jacobian).block(0, 0, constraintIterator->get()->controlJacobianBuffer.rows(), state.size()) =
                        toEigen(constraintIterator->get()->controlJacobianBuffer);
                unsigned int nMissing = m_pimpl->maxConstraintSize - static_cast<unsigned int>(constraintIterator->get()->constraint->constraintSize());
                toEigen(jacobian).block(constraintIterator->get()->controlJacobianBuffer.rows(), 0, nMissing, state.size()).setZero();
            } else {
                jacobian = constraintIterator->get()->controlJacobianBuffer;
            }

            return true;
        }